

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool __thiscall libcellml::Units::removeUnit(Units *this,StandardUnit standardUnit)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  string reference;
  string local_38;
  
  lVar3 = 0x2fb488;
  if (standardUnitToString_abi_cxx11_._16_8_ != 0) {
    lVar3 = 0x2fb488;
    lVar2 = standardUnitToString_abi_cxx11_._16_8_;
    do {
      if ((int)standardUnit <= *(int *)(lVar2 + 0x20)) {
        lVar3 = lVar2;
      }
      lVar2 = *(long *)(lVar2 + 0x10 + (ulong)(*(int *)(lVar2 + 0x20) < (int)standardUnit) * 8);
    } while (lVar2 != 0);
  }
  lVar2 = 0x2fb488;
  if ((lVar3 != 0x2fb488) && (lVar2 = 0x2fb488, *(int *)(lVar3 + 0x20) <= (int)standardUnit)) {
    lVar2 = lVar3;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,*(long *)(lVar2 + 0x28),
             *(long *)(lVar2 + 0x30) + *(long *)(lVar2 + 0x28));
  bVar1 = removeUnit(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool Units::removeUnit(StandardUnit standardUnit)
{
    const std::string reference = standardUnitToString.find(standardUnit)->second;
    return removeUnit(reference);
}